

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

bool __thiscall pugi::xml_text::set(xml_text *this,int rhs)

{
  bool bVar1;
  xml_node_struct *header;
  int in_ECX;
  
  header = _data_new(this);
  if (header != (xml_node_struct *)0x0) {
    bVar1 = impl::anon_unknown_0::set_value_convert
                      (&header->value,&header->header,(ulong)(uint)rhs,in_ECX);
    return bVar1;
  }
  return false;
}

Assistant:

PUGI__FN bool xml_text::set(int rhs)
	{
		xml_node_struct* dn = _data_new();

		return dn ? impl::set_value_convert(dn->value, dn->header, impl::xml_memory_page_value_allocated_mask, rhs) : false;
	}